

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alrecord.c
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  FILE *pFVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  FILE *pFVar8;
  void *pvVar9;
  size_t sVar10;
  int *piVar11;
  char *pcVar12;
  undefined8 uVar13;
  char *pcVar14;
  char *pcVar15;
  char **ppcVar16;
  int iVar17;
  uint uVar18;
  float fVar19;
  double dVar20;
  void *local_80;
  ulong local_78;
  ALCint count;
  char *end;
  char *local_60;
  char *local_58;
  double local_50;
  uint local_44;
  long local_40;
  long local_38;
  
  pcVar14 = *argv;
  if (argc < 2) {
LAB_0010237c:
    iVar17 = 0;
    fprintf(_stderr,
            "Record from a device to a wav file.\n\nUsage: %s [-device <name>] [options...]\n\nAvailable options:\n%s\n"
            ,pcVar14,
            "    --channels/-c <channels>  Set channel count (1 or 2)\n    --bits/-b <bits>          Set channel count (8, 16, or 32)\n    --rate/-r <rate>          Set sample rate (8000 to 96000)\n    --time/-t <time>          Time in seconds to record (1 to 10)\n    --outfile/-o <filename>   Output filename (default: record.wav)"
           );
  }
  else {
    ppcVar16 = argv + 1;
    uVar6 = 1;
    local_58 = pcVar14;
    if (argc == 2) {
      pcVar14 = (char *)0x0;
      iVar17 = 1;
    }
    else {
      iVar17 = strcmp(*ppcVar16,"-device");
      if (iVar17 == 0) {
        pcVar14 = argv[2];
        ppcVar16 = argv + 3;
        iVar17 = argc + -3;
      }
      else {
        iVar17 = argc + -1;
        pcVar14 = (char *)0x0;
      }
    }
    ppcVar16 = ppcVar16 + 1;
    local_50 = (double)CONCAT44(local_50._4_4_,0x40800000);
    local_78 = 0x10;
    local_80 = (void *)0xac44;
    local_60 = "record.wav";
    for (; 0 < iVar17; iVar17 = iVar17 + -2) {
      pcVar12 = ppcVar16[-1];
      cVar1 = *pcVar12;
      if (((cVar1 == '-') && (pcVar12[1] == '-')) && (pcVar12[2] == '\0')) break;
      iVar3 = strcmp(pcVar12,"--channels");
      if ((iVar3 == 0) || (((cVar1 == '-' && (pcVar12[1] == 'c')) && (pcVar12[2] == '\0')))) {
        if (iVar17 == 1) goto LAB_0010269e;
        uVar6 = strtoul(*ppcVar16,&end,0);
        if ((0xfffffffd < (int)uVar6 - 3U) && ((end == (char *)0x0 || (*end == '\0'))))
        goto LAB_0010265c;
        pcVar12 = *ppcVar16;
        pcVar14 = "Invalid channels: %s\n";
LAB_00102798:
        fprintf(_stderr,pcVar14,pcVar12);
        goto LAB_00102bf8;
      }
      iVar3 = strcmp(pcVar12,"--bits");
      if ((iVar3 == 0) || (((cVar1 == '-' && (pcVar12[1] == 'b')) && (pcVar12[2] == '\0')))) {
        if (iVar17 == 1) goto LAB_0010269e;
        local_78 = strtoul(*ppcVar16,&end,0);
        if (((0x20 < (uint)local_78) || ((0x100010100U >> (local_78 & 0x3f) & 1) == 0)) ||
           ((end != (char *)0x0 && (*end != '\0')))) {
          pcVar12 = *ppcVar16;
          pcVar14 = "Invalid bit count: %s\n";
          goto LAB_00102798;
        }
      }
      else {
        iVar3 = strcmp(pcVar12,"--rate");
        if ((iVar3 == 0) || (((cVar1 == '-' && (pcVar12[1] == 'r')) && (pcVar12[2] == '\0')))) {
          if (iVar17 == 1) goto LAB_0010269e;
          local_80 = (void *)strtoul(*ppcVar16,&end,0);
          if ((88000 < (int)local_80 - 8000U) || ((end != (char *)0x0 && (*end != '\0')))) {
            pcVar12 = *ppcVar16;
            pcVar14 = "Invalid sample rate: %s\n";
            goto LAB_00102798;
          }
        }
        else {
          iVar3 = strcmp(pcVar12,"--time");
          if ((iVar3 == 0) || (((cVar1 == '-' && (pcVar12[1] == 't')) && (pcVar12[2] == '\0')))) {
            if (iVar17 == 1) goto LAB_0010269e;
            fVar19 = strtof(*ppcVar16,&end);
            local_50 = (double)CONCAT44(local_50._4_4_,fVar19);
            if (((fVar19 < 1.0) || (10.0 < fVar19)) || ((end != (char *)0x0 && (*end != '\0')))) {
              pcVar12 = *ppcVar16;
              pcVar14 = "Invalid record time: %s\n";
              goto LAB_00102798;
            }
          }
          else {
            iVar3 = strcmp(pcVar12,"--outfile");
            if ((iVar3 != 0) && (((cVar1 != '-' || (pcVar12[1] != 'o')) || (pcVar12[2] != '\0')))) {
              iVar17 = strcmp(pcVar12,"--help");
              pcVar14 = local_58;
              if ((iVar17 != 0) && (((cVar1 != '-' || (pcVar12[1] != 'h')) || (pcVar12[2] != '\0')))
                 ) {
                fprintf(_stderr,
                        "Invalid option \'%s\'.\n\nUsage: %s [-device <name>] [options...]\n\nAvailable options:\n%s\n"
                        ,pcVar12,local_58,
                        "    --channels/-c <channels>  Set channel count (1 or 2)\n    --bits/-b <bits>          Set channel count (8, 16, or 32)\n    --rate/-r <rate>          Set sample rate (8000 to 96000)\n    --time/-t <time>          Time in seconds to record (1 to 10)\n    --outfile/-o <filename>   Output filename (default: record.wav)"
                       );
                return 0;
              }
              goto LAB_0010237c;
            }
            if (iVar17 == 1) {
LAB_0010269e:
              pcVar14 = "Missing argument for option: %s\n";
              goto LAB_00102798;
            }
            local_60 = *ppcVar16;
          }
        }
      }
LAB_0010265c:
      ppcVar16 = ppcVar16 + 2;
    }
    iVar3 = (int)uVar6;
    iVar17 = (int)local_78;
    if (iVar3 == 1) {
      if (iVar17 == 8) {
        uVar13 = 0x1100;
      }
      else if (iVar17 == 0x20) {
        uVar13 = 0x10010;
      }
      else if (iVar17 == 0x10) {
        uVar13 = 0x1101;
      }
      else {
        uVar13 = 0;
      }
    }
    else {
      uVar13 = 0;
      if (iVar3 == 2) {
        if (iVar17 == 8) {
          uVar13 = 0x1102;
        }
        else if (iVar17 == 0x20) {
          uVar13 = 0x10011;
        }
        else if (iVar17 == 0x10) {
          uVar13 = 0x1103;
        }
      }
    }
    lVar7 = alcCaptureOpenDevice(pcVar14,(ulong)local_80 & 0xffffffff,uVar13,0x8000);
    pFVar8 = _stderr;
    if (lVar7 == 0) {
      pcVar12 = "default device";
      if (pcVar14 != (char *)0x0) {
        pcVar12 = pcVar14;
      }
      pcVar14 = "Signed";
      if (iVar17 == 8) {
        pcVar14 = "Unsigned";
      }
      pcVar15 = "Float";
      if (iVar17 != 0x20) {
        pcVar15 = pcVar14;
      }
      pcVar14 = "Stereo";
      if (iVar3 == 1) {
        pcVar14 = "Mono";
      }
      fprintf(_stderr,"Failed to open %s, %s %d-bit, %s, %dhz (%d samples)\n",pcVar12,pcVar15,
              local_78,pcVar14,local_80,0x8000);
    }
    else {
      uVar13 = alcGetString(lVar7,0x310);
      fprintf(pFVar8,"Opened \"%s\"\n",uVar13);
      pcVar14 = local_60;
      pFVar8 = fopen(local_60,"wb");
      if (pFVar8 == (FILE *)0x0) {
        fprintf(_stderr,"Failed to open \'%s\' for writing\n",pcVar14);
      }
      else {
        uVar18 = (uint)(iVar3 * iVar17) >> 3;
        local_40 = lVar7;
        fputs("RIFF",pFVar8);
        fwrite32le(0xffffffff,(FILE *)pFVar8);
        fputs("WAVE",pFVar8);
        fputs("fmt ",pFVar8);
        fwrite32le(0x12,(FILE *)pFVar8);
        fwrite16le((ushort)(iVar17 == 0x20) * 2 + 1,(FILE *)pFVar8);
        fwrite16le((ALushort)uVar6,(FILE *)pFVar8);
        fwrite32le((ALuint)local_80,(FILE *)pFVar8);
        fwrite32le(uVar18 * (ALuint)local_80,(FILE *)pFVar8);
        local_44 = uVar18;
        fwrite16le((ALushort)uVar18,(FILE *)pFVar8);
        fwrite16le((ALushort)local_78,(FILE *)pFVar8);
        fwrite16le(0,(FILE *)pFVar8);
        fputs("data",pFVar8);
        fwrite32le(0xffffffff,(FILE *)pFVar8);
        lVar7 = ftell(pFVar8);
        iVar4 = ferror(pFVar8);
        pFVar2 = _stderr;
        if ((3 < lVar7) && (iVar4 == 0)) {
          local_38 = lVar7 + -4;
          pcVar14 = "Signed";
          if (iVar17 == 8) {
            pcVar14 = "Unsigned";
          }
          pcVar12 = "Float";
          if (iVar17 != 0x20) {
            pcVar12 = pcVar14;
          }
          pcVar14 = "Stereo";
          if (iVar3 == 1) {
            pcVar14 = "Mono";
          }
          dVar20 = (double)local_50._0_4_;
          pcVar15 = "";
          if (local_50._0_4_ != 1.0) {
            pcVar15 = "s";
          }
          if (NAN(local_50._0_4_)) {
            pcVar15 = "s";
          }
          fprintf(_stderr,"Recording \'%s\', %s %d-bit, %s, %dhz (%g second%s)\n",local_60,pcVar12,
                  local_78,pcVar14,local_80,pcVar15);
          lVar7 = local_40;
          alcCaptureStart(local_40);
          local_50 = (double)((ulong)local_80 & 0xffffffff);
          local_58 = (char *)(ulong)local_44;
          local_60 = (char *)((ulong)local_60 & 0xffffffff00000000);
          local_80 = (void *)0x0;
          uVar18 = 0;
          while ((double)uVar18 / local_50 < dVar20) {
            uVar5 = alcGetError(lVar7);
            if (uVar5 != 0) goto LAB_00102c14;
            iVar17 = ferror(pFVar8);
            if (iVar17 != 0) break;
            count = 0;
            fprintf(_stderr,"\rCaptured %u samples",(ulong)uVar18);
            alcGetIntegerv(lVar7,0x312,1,&count);
            pcVar14 = local_58;
            if ((long)count < 1) {
              al_nssleep(10000000);
            }
            else {
              if ((int)local_60 < count) {
                pvVar9 = calloc((size_t)local_58,(long)count);
                free(local_80);
                local_60 = (char *)CONCAT44(local_60._4_4_,count);
                local_80 = pvVar9;
              }
              alcCaptureSamples(lVar7,local_80);
              sVar10 = fwrite(local_80,(size_t)pcVar14,(ulong)(uint)count,pFVar8);
              uVar18 = uVar18 + (int)sVar10;
            }
          }
          uVar5 = 0;
LAB_00102c14:
          alcCaptureStop(lVar7);
          fprintf(_stderr,"\rCaptured %u samples\n",(ulong)uVar18);
          pFVar2 = _stderr;
          if (uVar5 != 0) {
            uVar13 = alcGetString(lVar7,uVar5);
            fprintf(pFVar2,"Got device error 0x%04x: %s\n",(ulong)uVar5,uVar13);
          }
          alcCaptureCloseDevice(lVar7);
          free(local_80);
          lVar7 = ftell(pFVar8);
          iVar17 = fseek(pFVar8,local_38,0);
          if (iVar17 == 0) {
            fwrite32le(uVar18 * local_44,(FILE *)pFVar8);
            iVar17 = fseek(pFVar8,4,0);
            if (iVar17 == 0) {
              fwrite32le((int)lVar7 - 8,(FILE *)pFVar8);
            }
          }
          fclose(pFVar8);
          return 0;
        }
        piVar11 = __errno_location();
        pcVar14 = strerror(*piVar11);
        fprintf(pFVar2,"Error writing header: %s\n",pcVar14);
        fclose(pFVar8);
        lVar7 = local_40;
      }
      alcCaptureCloseDevice(lVar7);
    }
LAB_00102bf8:
    iVar17 = 1;
  }
  return iVar17;
}

Assistant:

int main(int argc, char **argv)
{
    static const char optlist[] =
"    --channels/-c <channels>  Set channel count (1 or 2)\n"
"    --bits/-b <bits>          Set channel count (8, 16, or 32)\n"
"    --rate/-r <rate>          Set sample rate (8000 to 96000)\n"
"    --time/-t <time>          Time in seconds to record (1 to 10)\n"
"    --outfile/-o <filename>   Output filename (default: record.wav)";
    const char *fname = "record.wav";
    const char *devname = NULL;
    const char *progname;
    Recorder recorder;
    long total_size;
    ALenum format;
    ALCenum err;

    progname = argv[0];
    if(argc < 2)
    {
        fprintf(stderr, "Record from a device to a wav file.\n\n"
                "Usage: %s [-device <name>] [options...]\n\n"
                "Available options:\n%s\n", progname, optlist);
        return 0;
    }

    recorder.mDevice = NULL;
    recorder.mFile = NULL;
    recorder.mDataSizeOffset = 0;
    recorder.mDataSize = 0;
    recorder.mRecTime = 4.0f;
    recorder.mChannels = 1;
    recorder.mBits = 16;
    recorder.mSampleRate = 44100;
    recorder.mFrameSize = recorder.mChannels * recorder.mBits / 8;
    recorder.mBuffer = NULL;
    recorder.mBufferSize = 0;

    argv++; argc--;
    if(argc > 1 && strcmp(argv[0], "-device") == 0)
    {
        devname = argv[1];
        argv += 2;
        argc -= 2;
    }

    while(argc > 0)
    {
        char *end;
        if(strcmp(argv[0], "--") == 0)
            break;
        else if(strcmp(argv[0], "--channels") == 0 || strcmp(argv[0], "-c") == 0)
        {
            if(argc < 2)
            {
                fprintf(stderr, "Missing argument for option: %s\n", argv[0]);
                return 1;
            }

            recorder.mChannels = (ALuint)strtoul(argv[1], &end, 0);
            if((recorder.mChannels != 1 && recorder.mChannels != 2) || (end && *end != '\0'))
            {
                fprintf(stderr, "Invalid channels: %s\n", argv[1]);
                return 1;
            }
            argv += 2;
            argc -= 2;
        }
        else if(strcmp(argv[0], "--bits") == 0 || strcmp(argv[0], "-b") == 0)
        {
            if(argc < 2)
            {
                fprintf(stderr, "Missing argument for option: %s\n", argv[0]);
                return 1;
            }

            recorder.mBits = (ALuint)strtoul(argv[1], &end, 0);
            if((recorder.mBits != 8 && recorder.mBits != 16 && recorder.mBits != 32) ||
               (end && *end != '\0'))
            {
                fprintf(stderr, "Invalid bit count: %s\n", argv[1]);
                return 1;
            }
            argv += 2;
            argc -= 2;
        }
        else if(strcmp(argv[0], "--rate") == 0 || strcmp(argv[0], "-r") == 0)
        {
            if(argc < 2)
            {
                fprintf(stderr, "Missing argument for option: %s\n", argv[0]);
                return 1;
            }

            recorder.mSampleRate = (ALuint)strtoul(argv[1], &end, 0);
            if(!(recorder.mSampleRate >= 8000 && recorder.mSampleRate <= 96000) || (end && *end != '\0'))
            {
                fprintf(stderr, "Invalid sample rate: %s\n", argv[1]);
                return 1;
            }
            argv += 2;
            argc -= 2;
        }
        else if(strcmp(argv[0], "--time") == 0 || strcmp(argv[0], "-t") == 0)
        {
            if(argc < 2)
            {
                fprintf(stderr, "Missing argument for option: %s\n", argv[0]);
                return 1;
            }

            recorder.mRecTime = strtof(argv[1], &end);
            if(!(recorder.mRecTime >= 1.0f && recorder.mRecTime <= 10.0f) || (end && *end != '\0'))
            {
                fprintf(stderr, "Invalid record time: %s\n", argv[1]);
                return 1;
            }
            argv += 2;
            argc -= 2;
        }
        else if(strcmp(argv[0], "--outfile") == 0 || strcmp(argv[0], "-o") == 0)
        {
            if(argc < 2)
            {
                fprintf(stderr, "Missing argument for option: %s\n", argv[0]);
                return 1;
            }

            fname = argv[1];
            argv += 2;
            argc -= 2;
        }
        else if(strcmp(argv[0], "--help") == 0 || strcmp(argv[0], "-h") == 0)
        {
            fprintf(stderr, "Record from a device to a wav file.\n\n"
                    "Usage: %s [-device <name>] [options...]\n\n"
                    "Available options:\n%s\n", progname, optlist);
            return 0;
        }
        else
        {
            fprintf(stderr, "Invalid option '%s'.\n\n"
                    "Usage: %s [-device <name>] [options...]\n\n"
                    "Available options:\n%s\n", argv[0], progname, optlist);
            return 0;
        }
    }

    recorder.mFrameSize = recorder.mChannels * recorder.mBits / 8;

    format = AL_NONE;
    if(recorder.mChannels == 1)
    {
        if(recorder.mBits == 8)
            format = AL_FORMAT_MONO8;
        else if(recorder.mBits == 16)
            format = AL_FORMAT_MONO16;
        else if(recorder.mBits == 32)
            format = AL_FORMAT_MONO_FLOAT32;
    }
    else if(recorder.mChannels == 2)
    {
        if(recorder.mBits == 8)
            format = AL_FORMAT_STEREO8;
        else if(recorder.mBits == 16)
            format = AL_FORMAT_STEREO16;
        else if(recorder.mBits == 32)
            format = AL_FORMAT_STEREO_FLOAT32;
    }

    recorder.mDevice = alcCaptureOpenDevice(devname, recorder.mSampleRate, format, 32768);
    if(!recorder.mDevice)
    {
        fprintf(stderr, "Failed to open %s, %s %d-bit, %s, %dhz (%d samples)\n",
            devname ? devname : "default device",
            (recorder.mBits == 32) ? "Float" :
            (recorder.mBits !=  8) ? "Signed" : "Unsigned", recorder.mBits,
            (recorder.mChannels == 1) ? "Mono" : "Stereo", recorder.mSampleRate,
            32768
        );
        return 1;
    }
    fprintf(stderr, "Opened \"%s\"\n", alcGetString(
        recorder.mDevice, ALC_CAPTURE_DEVICE_SPECIFIER
    ));

    recorder.mFile = fopen(fname, "wb");
    if(!recorder.mFile)
    {
        fprintf(stderr, "Failed to open '%s' for writing\n", fname);
        alcCaptureCloseDevice(recorder.mDevice);
        return 1;
    }

    fputs("RIFF", recorder.mFile);
    fwrite32le(0xFFFFFFFF, recorder.mFile); // 'RIFF' header len; filled in at close

    fputs("WAVE", recorder.mFile);

    fputs("fmt ", recorder.mFile);
    fwrite32le(18, recorder.mFile); // 'fmt ' header len

    // 16-bit val, format type id (1 = integer PCM, 3 = float PCM)
    fwrite16le((recorder.mBits == 32) ? 0x0003 : 0x0001, recorder.mFile);
    // 16-bit val, channel count
    fwrite16le((ALushort)recorder.mChannels, recorder.mFile);
    // 32-bit val, frequency
    fwrite32le(recorder.mSampleRate, recorder.mFile);
    // 32-bit val, bytes per second
    fwrite32le(recorder.mSampleRate * recorder.mFrameSize, recorder.mFile);
    // 16-bit val, frame size
    fwrite16le((ALushort)recorder.mFrameSize, recorder.mFile);
    // 16-bit val, bits per sample
    fwrite16le((ALushort)recorder.mBits, recorder.mFile);
    // 16-bit val, extra byte count
    fwrite16le(0, recorder.mFile);

    fputs("data", recorder.mFile);
    fwrite32le(0xFFFFFFFF, recorder.mFile); // 'data' header len; filled in at close

    recorder.mDataSizeOffset = ftell(recorder.mFile) - 4;
    if(ferror(recorder.mFile) || recorder.mDataSizeOffset < 0)
    {
        fprintf(stderr, "Error writing header: %s\n", strerror(errno));
        fclose(recorder.mFile);
        alcCaptureCloseDevice(recorder.mDevice);
        return 1;
    }

    fprintf(stderr, "Recording '%s', %s %d-bit, %s, %dhz (%g second%s)\n", fname,
        (recorder.mBits == 32) ? "Float" :
        (recorder.mBits !=  8) ? "Signed" : "Unsigned", recorder.mBits,
        (recorder.mChannels == 1) ? "Mono" : "Stereo", recorder.mSampleRate,
        recorder.mRecTime, (recorder.mRecTime != 1.0f) ? "s" : ""
    );

    err = ALC_NO_ERROR;
    alcCaptureStart(recorder.mDevice);
    while((double)recorder.mDataSize/(double)recorder.mSampleRate < recorder.mRecTime &&
          (err=alcGetError(recorder.mDevice)) == ALC_NO_ERROR && !ferror(recorder.mFile))
    {
        ALCint count = 0;
        fprintf(stderr, "\rCaptured %u samples", recorder.mDataSize);
        alcGetIntegerv(recorder.mDevice, ALC_CAPTURE_SAMPLES, 1, &count);
        if(count < 1)
        {
            al_nssleep(10000000);
            continue;
        }
        if(count > recorder.mBufferSize)
        {
            ALbyte *data = calloc(recorder.mFrameSize, (ALuint)count);
            free(recorder.mBuffer);
            recorder.mBuffer = data;
            recorder.mBufferSize = count;
        }
        alcCaptureSamples(recorder.mDevice, recorder.mBuffer, count);
#if defined(__BYTE_ORDER) && __BYTE_ORDER == __BIG_ENDIAN
        /* Byteswap multibyte samples on big-endian systems (wav needs little-
         * endian, and OpenAL gives the system's native-endian).
         */
        if(recorder.mBits == 16)
        {
            ALCint i;
            for(i = 0;i < count*recorder.mChannels;i++)
            {
                ALbyte b = recorder.mBuffer[i*2 + 0];
                recorder.mBuffer[i*2 + 0] = recorder.mBuffer[i*2 + 1];
                recorder.mBuffer[i*2 + 1] = b;
            }
        }
        else if(recorder.mBits == 32)
        {
            ALCint i;
            for(i = 0;i < count*recorder.mChannels;i++)
            {
                ALbyte b0 = recorder.mBuffer[i*4 + 0];
                ALbyte b1 = recorder.mBuffer[i*4 + 1];
                recorder.mBuffer[i*4 + 0] = recorder.mBuffer[i*4 + 3];
                recorder.mBuffer[i*4 + 1] = recorder.mBuffer[i*4 + 2];
                recorder.mBuffer[i*4 + 2] = b1;
                recorder.mBuffer[i*4 + 3] = b0;
            }
        }
#endif
        recorder.mDataSize += (ALuint)fwrite(recorder.mBuffer, recorder.mFrameSize, (ALuint)count,
                                             recorder.mFile);
    }
    alcCaptureStop(recorder.mDevice);
    fprintf(stderr, "\rCaptured %u samples\n", recorder.mDataSize);
    if(err != ALC_NO_ERROR)
        fprintf(stderr, "Got device error 0x%04x: %s\n", err, alcGetString(recorder.mDevice, err));

    alcCaptureCloseDevice(recorder.mDevice);
    recorder.mDevice = NULL;

    free(recorder.mBuffer);
    recorder.mBuffer = NULL;
    recorder.mBufferSize = 0;

    total_size = ftell(recorder.mFile);
    if(fseek(recorder.mFile, recorder.mDataSizeOffset, SEEK_SET) == 0)
    {
        fwrite32le(recorder.mDataSize*recorder.mFrameSize, recorder.mFile);
        if(fseek(recorder.mFile, 4, SEEK_SET) == 0)
            fwrite32le((ALuint)total_size - 8, recorder.mFile);
    }

    fclose(recorder.mFile);
    recorder.mFile = NULL;

    return 0;
}